

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *pvVar1;
  char *pcVar2;
  char *pcVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  pointer pTVar7;
  pointer pTVar8;
  size_type in_R9;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *p_Var9;
  StringRef lhs;
  StringRef lhs_00;
  StringRef rhs;
  StringRef rhs_00;
  ParserResult result;
  int local_168;
  StringRef SStack_160;
  undefined1 local_148 [24];
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_130;
  Result validationResult;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_d8;
  StringRef *local_b8;
  StringRef *pSStack_b0;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_a8;
  StringRef *local_88;
  StringRef *pSStack_80;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_78;
  StringRef *local_58;
  StringRef *pSStack_50;
  _Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> local_48;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])(&validationResult);
  if (validationResult.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&validationResult);
    goto LAB_001393dc;
  }
  pvVar1 = &tokens->m_tokenBuffer;
  pTVar7 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar8 = (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((pTVar7 == pTVar8) && ((tokens->it)._M_current == (tokens->itEnd)._M_current)) ||
     (pTVar7->type != Option)) {
LAB_00139371:
    p_Var9 = &local_d8;
    result.m_errorMessage.field_2._8_8_ =
         (tokens->m_tokenBuffer).
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar1->
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase.
    _0_4_ = 1;
    result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._8_8_ =
         (tokens->it)._M_current;
    result.m_errorMessage._M_dataplus._M_p = (pointer)(tokens->itEnd)._M_current;
    local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.m_errorMessage._M_string_length = (size_type)pTVar7;
    result.m_errorMessage.field_2._M_allocated_capacity = (size_type)pTVar8;
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
              (__return_storage_ptr__,(ParseState *)&result);
  }
  else {
    pcVar2 = (pTVar7->token).m_start;
    pcVar3 = (char *)(pTVar7->token).m_size;
    bVar5 = isMatch(this,pTVar7->token);
    if (!bVar5) {
      pTVar7 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar8 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00139371;
    }
    iVar6 = (*((this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar4 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar6 == '\0') {
      Detail::TokenStream::operator++(tokens);
      pTVar7 = (tokens->m_tokenBuffer).
               super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((pTVar7 == (tokens->m_tokenBuffer).
                     super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                     ._M_impl.super__Vector_impl_data._M_finish) &&
         ((tokens->it)._M_current == (tokens->itEnd)._M_current)) {
        lhs.m_size = (size_type)pcVar2;
        lhs.m_start = (char *)0x1c;
        rhs.m_size = in_R9;
        rhs.m_start = pcVar3;
        operator+[abi_cxx11_((string *)&result,(Catch *)"Expected argument following ",lhs,rhs);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                  (__return_storage_ptr__,(string *)&result);
      }
      else {
        SStack_160.m_start = (pTVar7->token).m_start;
        SStack_160.m_size = (pTVar7->token).m_size;
        local_168 = (int)*(undefined8 *)pTVar7;
        if (local_168 == 1) {
          StringRef::operator_cast_to_string((string *)local_148,&SStack_160);
          (*peVar4->_vptr_BoundRef[4])(&result,peVar4,local_148);
          std::__cxx11::string::~string((string *)local_148);
          if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type ==
              Ok) {
            (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_
                != 2) goto LAB_001395e7;
            (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            local_88 = (tokens->it)._M_current;
            pSStack_80 = (tokens->itEnd)._M_current;
            p_Var9 = &local_78;
            local_130._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_130._M_impl.super__Vector_impl_data._M_start =
                 (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_130._M_impl.super__Vector_impl_data._M_finish =
                 (tokens->m_tokenBuffer).
                 super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            (pvVar1->
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (tokens->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (tokens->m_tokenBuffer).
            super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_148._0_4_ =
                 result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_
            ;
            local_148._8_8_ = (tokens->it)._M_current;
            local_148._16_8_ = (tokens->itEnd)._M_current;
            local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,(ParseState *)local_148);
            goto LAB_0013951e;
          }
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          BasicResult<Catch::Clara::ParseResultType>(__return_storage_ptr__,&result);
          goto LAB_0013952e;
        }
        lhs_00.m_size = (size_type)pcVar2;
        lhs_00.m_start = (char *)0x1c;
        rhs_00.m_size = in_R9;
        rhs_00.m_start = pcVar3;
        operator+[abi_cxx11_
                  ((string *)&result,(Catch *)"Expected argument following ",lhs_00,rhs_00);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                  (__return_storage_ptr__,(string *)&result);
      }
      std::__cxx11::string::~string((string *)&result);
      goto LAB_001393dc;
    }
    (*peVar4->_vptr_BoundRef[4])(&result,peVar4,1);
    if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type != Ok) {
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::
      BasicResult<Catch::Clara::ParseResultType>(__return_storage_ptr__,&result);
LAB_0013952e:
      Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
      goto LAB_001393dc;
    }
    (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                          super_ResultBase._vptr_ResultBase._4_4_,
                          result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                          super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
    if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ == 2) {
      (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                            super_ResultBase._vptr_ResultBase._4_4_,
                            result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                            super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
      local_58 = (tokens->it)._M_current;
      pSStack_50 = (tokens->itEnd)._M_current;
      p_Var9 = &local_48;
      local_130._M_impl.super__Vector_impl_data._M_end_of_storage =
           (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_130._M_impl.super__Vector_impl_data._M_start =
           (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_130._M_impl.super__Vector_impl_data._M_finish =
           (tokens->m_tokenBuffer).
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pvVar1->
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>)
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (tokens->m_tokenBuffer).
      super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_148._0_4_ =
           result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_;
      local_148._8_8_ = (tokens->it)._M_current;
      local_148._16_8_ = (tokens->itEnd)._M_current;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                (__return_storage_ptr__,(ParseState *)local_148);
LAB_0013951e:
      std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~_Vector_base(&local_130);
      std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
      ~_Vector_base(p_Var9);
      goto LAB_0013952e;
    }
LAB_001395e7:
    Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
    Detail::TokenStream::operator++(tokens);
    local_b8 = (tokens->it)._M_current;
    pSStack_b0 = (tokens->itEnd)._M_current;
    p_Var9 = &local_a8;
    result.m_errorMessage.field_2._8_8_ =
         (tokens->m_tokenBuffer).
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    result.m_errorMessage._M_string_length =
         (size_type)
         (tokens->m_tokenBuffer).
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_start;
    result.m_errorMessage.field_2._M_allocated_capacity =
         (size_type)
         (tokens->m_tokenBuffer).
         super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pvVar1->
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (tokens->m_tokenBuffer).
    super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase.
    _0_4_ = 0;
    result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._8_8_ =
         (tokens->it)._M_current;
    result.m_errorMessage._M_dataplus._M_p = (pointer)(tokens->itEnd)._M_current;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
              (__return_storage_ptr__,(ParseState *)&result);
  }
  std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
  ~_Vector_base((_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                 *)&result.m_errorMessage._M_string_length);
  std::_Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
  ~_Vector_base(p_Var9);
LAB_001393dc:
  Detail::BasicResult<void>::~BasicResult(&validationResult);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            if (tokens &&
                tokens->type == Detail::TokenType::Option) {
                auto const& token = *tokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++tokens;
                        if (!tokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *tokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(static_cast<std::string>(argToken.token));
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), CATCH_MOVE(tokens)));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, CATCH_MOVE(++tokens)));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, CATCH_MOVE(tokens)));
        }